

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O0

int __thiscall QInputDialog::open(QInputDialog *this,char *__file,int __oflag,...)

{
  QInputDialogPrivate *pQVar1;
  QObject *pQVar2;
  int __oflag_00;
  long in_FS_OFFSET;
  QInputDialogPrivate *d;
  QObject *in_stack_ffffffffffffffb8;
  QObject *this_00;
  QObject local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QInputDialog *)0x79d1d4);
  pQVar2 = (QObject *)signalForMember((char *)this);
  this_00 = local_10;
  QObject::connect(this_00,(char *)this,pQVar2,__file,(ConnectionType)___oflag);
  QMetaObject::Connection::~Connection((Connection *)this_00);
  QPointer<QObject>::operator=((QPointer<QObject> *)this_00,in_stack_ffffffffffffffb8);
  QByteArray::operator=(&pQVar1->memberToDisconnectOnClose,___oflag);
  QDialog::open(&this->super_QDialog,___oflag,__oflag_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QInputDialog::open(QObject *receiver, const char *member)
{
    Q_D(QInputDialog);
    connect(this, signalForMember(member), receiver, member);
    d->receiverToDisconnectOnClose = receiver;
    d->memberToDisconnectOnClose = member;
    QDialog::open();
}